

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O1

void __thiscall soul::PoolAllocator::clear(PoolAllocator *this)

{
  pointer puVar1;
  pointer puVar2;
  Pool *pPVar3;
  pointer this_00;
  
  puVar1 = (this->pools).
           super__Vector_base<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>,_std::allocator<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->pools).
           super__Vector_base<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>,_std::allocator<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = puVar1;
  if (puVar2 != puVar1) {
    do {
      std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>::
      ~unique_ptr(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != puVar2);
    (this->pools).
    super__Vector_base<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>,_std::allocator<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar1;
  }
  std::
  vector<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>,_std::allocator<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>_>_>
  ::reserve(&this->pools,0x20);
  pPVar3 = (Pool *)operator_new(0xfff0);
  pPVar3->nextSlot = 0;
  this->currentPool = pPVar3;
  std::
  vector<std::unique_ptr<soul::PoolAllocator::Pool,std::default_delete<soul::PoolAllocator::Pool>>,std::allocator<std::unique_ptr<soul::PoolAllocator::Pool,std::default_delete<soul::PoolAllocator::Pool>>>>
  ::emplace_back<soul::PoolAllocator::Pool*&>
            ((vector<std::unique_ptr<soul::PoolAllocator::Pool,std::default_delete<soul::PoolAllocator::Pool>>,std::allocator<std::unique_ptr<soul::PoolAllocator::Pool,std::default_delete<soul::PoolAllocator::Pool>>>>
              *)this,&this->currentPool);
  return;
}

Assistant:

void clear()
    {
        pools.clear();
        pools.reserve (32);
        addNewPool();
    }